

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc-type-utils.h
# Opt level: O0

EvaluationResult wasm::GCTypeUtils::flipEvaluationResult(EvaluationResult result)

{
  EvaluationResult local_c;
  EvaluationResult result_local;
  
  switch(result) {
  case Unknown:
    local_c = Unknown;
    break;
  case Success:
    local_c = Failure;
    break;
  case Failure:
    local_c = Success;
    break;
  case SuccessOnlyIfNull:
    local_c = SuccessOnlyIfNonNull;
    break;
  case SuccessOnlyIfNonNull:
    local_c = SuccessOnlyIfNull;
    break;
  case Unreachable:
    local_c = Unreachable;
    break;
  default:
    handle_unreachable("unexpected result",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/gc-type-utils.h"
                       ,0x41);
  }
  return local_c;
}

Assistant:

inline EvaluationResult flipEvaluationResult(EvaluationResult result) {
  switch (result) {
    case Unknown:
      return Unknown;
    case Success:
      return Failure;
    case Failure:
      return Success;
    case SuccessOnlyIfNull:
      return SuccessOnlyIfNonNull;
    case SuccessOnlyIfNonNull:
      return SuccessOnlyIfNull;
    case Unreachable:
      return Unreachable;
  }
  WASM_UNREACHABLE("unexpected result");
}